

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

int loop_filter_row_worker(void *arg1,void *arg2)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  int iVar2;
  long lVar3;
  aom_internal_error_info *in_stack_ffffffffffffffa0;
  
  __mutex = *(pthread_mutex_t **)((long)arg1 + 0x60);
  iVar2 = _setjmp((__jmp_buf_tag *)((long)arg2 + 0x21a0));
  if (iVar2 == 0) {
    *(undefined4 *)((long)arg2 + 0x2198) = 1;
    pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x60));
    if (*(char *)((long)arg1 + 0x78) == '\0') {
      do {
        iVar2 = *(int *)((long)arg1 + 0x74);
        if (*(int *)((long)arg1 + 0x70) <= iVar2) break;
        lVar1 = *(long *)((long)arg1 + 0x68);
        *(int *)((long)arg1 + 0x74) = iVar2 + 1;
        pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x60));
        if (lVar1 == 0) goto LAB_003b2869;
        lVar3 = (long)iVar2 * 0x10;
        av1_thread_loop_filter_rows
                  (*arg2,*(AV1_COMMON **)((long)arg2 + 8),(macroblockd_plane *)((long)arg2 + 0x10),
                   *(MACROBLOCKD **)((long)arg2 + 0x1ea0),*(int *)(lVar1 + lVar3),
                   *(int *)(lVar1 + 4 + lVar3),*(int *)(lVar1 + 8 + lVar3),
                   *(int *)(lVar1 + 0xc + lVar3),(AV1LfSync *)arg1,in_stack_ffffffffffffffa0,
                   (AV1_DEBLOCKING_PARAMETERS *)((long)arg2 + 0x1ea8),
                   (TX_SIZE *)((long)arg2 + 0x20a8),5);
        pthread_mutex_lock(*(pthread_mutex_t **)((long)arg1 + 0x60));
      } while (*(char *)((long)arg1 + 0x78) == '\0');
    }
    pthread_mutex_unlock(*(pthread_mutex_t **)((long)arg1 + 0x60));
LAB_003b2869:
    *(undefined4 *)((long)arg2 + 0x2198) = 0;
    iVar2 = 1;
  }
  else {
    *(undefined4 *)((long)arg2 + 0x2198) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)arg1 + 0x78) = 1;
    pthread_mutex_unlock(__mutex);
    av1_set_vert_loop_filter_done(*(AV1_COMMON **)((long)arg2 + 8),(AV1LfSync *)arg1,5);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int loop_filter_row_worker(void *arg1, void *arg2) {
  AV1LfSync *const lf_sync = (AV1LfSync *)arg1;
  LFWorkerData *const lf_data = (LFWorkerData *)arg2;
  AV1LfMTInfo *cur_job_info;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *job_mutex_ = lf_sync->job_mutex;
#endif

  struct aom_internal_error_info *const error_info = &lf_data->error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(job_mutex_);
    lf_sync->lf_mt_exit = true;
    pthread_mutex_unlock(job_mutex_);
#endif
    av1_set_vert_loop_filter_done(lf_data->cm, lf_sync, MAX_MIB_SIZE_LOG2);
    return 0;
  }
  error_info->setjmp = 1;

  while ((cur_job_info = get_lf_job_info(lf_sync)) != NULL) {
    const int lpf_opt_level = cur_job_info->lpf_opt_level;
    av1_thread_loop_filter_rows(
        lf_data->frame_buffer, lf_data->cm, lf_data->planes, lf_data->xd,
        cur_job_info->mi_row, cur_job_info->plane, cur_job_info->dir,
        lpf_opt_level, lf_sync, error_info, lf_data->params_buf,
        lf_data->tx_buf, MAX_MIB_SIZE_LOG2);
  }
  error_info->setjmp = 0;
  return 1;
}